

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

void __thiscall spvtools::opt::DistanceVector::DistanceVector(DistanceVector *this,size_t size)

{
  allocator<spvtools::opt::DistanceEntry> local_41;
  DistanceEntry local_40;
  size_t local_18;
  size_t size_local;
  DistanceVector *this_local;
  
  local_18 = size;
  size_local = (size_t)this;
  DistanceEntry::DistanceEntry(&local_40);
  std::allocator<spvtools::opt::DistanceEntry>::allocator(&local_41);
  std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::vector
            (&this->entries,size,&local_40,&local_41);
  std::allocator<spvtools::opt::DistanceEntry>::~allocator(&local_41);
  return;
}

Assistant:

explicit DistanceVector(size_t size) : entries(size, DistanceEntry{}) {}